

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Module.c
# Opt level: O0

int init(EVP_PKEY_CTX *ctx)

{
  MCRegisterInfo *MRI;
  MCRegisterInfo *mri;
  cs_struct *ud_local;
  
  if ((*(uint *)(ctx + 4) & 0x7fffffff) == 0) {
    MRI = (MCRegisterInfo *)(*cs_mem_malloc)(0x58);
    AArch64_init(MRI);
    *(code **)(ctx + 8) = AArch64_printInst;
    *(MCRegisterInfo **)(ctx + 0x10) = MRI;
    *(MCRegisterInfo **)(ctx + 0x20) = MRI;
    *(code **)(ctx + 0x18) = AArch64_getInstruction;
    *(code **)(ctx + 0x30) = AArch64_reg_name;
    *(code **)(ctx + 0x48) = AArch64_get_insn_id;
    *(code **)(ctx + 0x38) = AArch64_insn_name;
    *(code **)(ctx + 0x40) = AArch64_group_name;
    *(code **)(ctx + 0x50) = AArch64_post_printer;
    ud_local._4_4_ = 0;
  }
  else {
    ud_local._4_4_ = 5;
  }
  return ud_local._4_4_;
}

Assistant:

static cs_err init(cs_struct *ud)
{
	MCRegisterInfo *mri;

	// verify if requested mode is valid
	if (ud->mode & ~(CS_MODE_LITTLE_ENDIAN | CS_MODE_ARM | CS_MODE_BIG_ENDIAN))
		return CS_ERR_MODE;

	mri = cs_mem_malloc(sizeof(*mri));

	AArch64_init(mri);
	ud->printer = AArch64_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->disasm = AArch64_getInstruction;
	ud->reg_name = AArch64_reg_name;
	ud->insn_id = AArch64_get_insn_id;
	ud->insn_name = AArch64_insn_name;
	ud->group_name = AArch64_group_name;
	ud->post_printer = AArch64_post_printer;

	return CS_ERR_OK;
}